

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O0

uint64_t helper_bfffo_mem_m68k(CPUM68KState_conflict *env,uint32_t addr,int32_t ofs,uint32_t len)

{
  uint32_t uVar1;
  uint64_t uVar2;
  ulong uVar3;
  bf_data bVar4;
  uintptr_t unaff_retaddr;
  uint32_t ffo;
  uint64_t n;
  uint64_t mask;
  uint64_t data;
  bf_data d;
  uintptr_t ra;
  uint32_t len_local;
  int32_t ofs_local;
  uint32_t addr_local;
  CPUM68KState_conflict *env_local;
  
  bVar4 = bf_prep(addr,ofs,len);
  data._0_4_ = bVar4.addr;
  d.addr = bVar4.blen;
  uVar2 = bf_load(env,(uint32_t)data,d.addr,unaff_retaddr);
  d.bofs = bVar4.len;
  uVar3 = (uVar2 & (ulong)(-1L << (0x40U - (char)bVar4.len & 0x3f)) >> ((byte)bVar4.bofs & 0x3f)) <<
          ((byte)bVar4.bofs & 0x3f);
  uVar1 = helper_bfffo_reg_m68k((uint32_t)(uVar3 >> 0x20),ofs,d.bofs);
  return uVar3 | uVar1;
}

Assistant:

uint64_t HELPER(bfffo_mem)(CPUM68KState *env, uint32_t addr,
                           int32_t ofs, uint32_t len)
{
    uintptr_t ra = GETPC();
    struct bf_data d = bf_prep(addr, ofs, len);
    uint64_t data = bf_load(env, d.addr, d.blen, ra);
#ifdef _MSC_VER
    uint64_t mask = 0xffffffffffffffffULL << (64 - d.len) >> d.bofs;
#else
    uint64_t mask = -1ull << (64 - d.len) >> d.bofs;
#endif
    uint64_t n = (data & mask) << d.bofs;
    uint32_t ffo = helper_bfffo_reg(n >> 32, ofs, d.len);

    /*
     * Return FFO in the low word and N in the high word.
     * Note that because of MASK and the shift, the low word
     * is already zero.
     */
    return n | ffo;
}